

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O0

void __thiscall dlib::label::label(label *this,drawable_window *w)

{
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RSI;
  drawable_window *in_RDI;
  drawable *in_stack_00000090;
  unsigned_long in_stack_ffffffffffffffd0;
  uchar red_;
  uint in_stack_ffffffffffffffe4;
  
  red_ = '\0';
  drawable::drawable((drawable *)((ulong)in_stack_ffffffffffffffe4 << 0x20),in_RDI,
                     in_stack_ffffffffffffffd0);
  (in_RDI->super_base_window)._vptr_base_window = (_func_int **)&PTR__label_0055c210;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(in_RSI);
  rgb_pixel::rgb_pixel
            ((rgb_pixel *)
             &(in_RDI->widgets).
              super_binary_search_tree_kernel_1<long,_dlib::set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<long>_>
              .tree_height,red_,red_,red_);
  drawable::enable_events(in_stack_00000090);
  return;
}

Assistant:

label(
            drawable_window& w
        ) : 
            drawable(w),
            text_color_(0,0,0)
        {
            enable_events();
        }